

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_CDict *cdict;
  void *ptr;
  size_t sVar1;
  long lVar2;
  
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    cdict = (ZSTD_CDict *)ZSTD_malloc(0x1308,customMem);
    lVar2 = 0;
    if (cParams.strategy != ZSTD_fast) {
      lVar2 = 1L << ((byte)cParams.chainLog & 0x3f);
    }
    sVar1 = ((1L << ((byte)cParams.hashLog & 0x3f)) + lVar2) * 4 + 0x1804;
    ptr = ZSTD_malloc(sVar1,customMem);
    if ((cdict == (ZSTD_CDict *)0x0) || (ptr == (void *)0x0)) {
      ZSTD_free(cdict,customMem);
      ZSTD_free(ptr,customMem);
    }
    else {
      (cdict->customMem).opaque = customMem.opaque;
      (cdict->customMem).customAlloc = customMem.customAlloc;
      (cdict->customMem).customFree = customMem.customFree;
      cdict->workspace = ptr;
      cdict->workspaceSize = sVar1;
      sVar1 = ZSTD_initCDict_internal
                        (cdict,dictBuffer,dictSize,dictLoadMethod,dictContentType,cParams);
      if (sVar1 < 0xffffffffffffff89) {
        return cdict;
      }
      ZSTD_freeCDict(cdict);
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams, ZSTD_customMem customMem)
{
    DEBUGLOG(3, "ZSTD_createCDict_advanced, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   ZSTD_CDict* const cdict = (ZSTD_CDict*)ZSTD_malloc(sizeof(ZSTD_CDict), customMem);
        size_t const workspaceSize = HUF_WORKSPACE_SIZE + ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
        void* const workspace = ZSTD_malloc(workspaceSize, customMem);

        if (!cdict || !workspace) {
            ZSTD_free(cdict, customMem);
            ZSTD_free(workspace, customMem);
            return NULL;
        }
        cdict->customMem = customMem;
        cdict->workspace = workspace;
        cdict->workspaceSize = workspaceSize;
        if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                        dictBuffer, dictSize,
                                        dictLoadMethod, dictContentType,
                                        cParams) )) {
            ZSTD_freeCDict(cdict);
            return NULL;
        }

        return cdict;
    }
}